

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

void re2::PatchList::Patch(Inst *inst0,PatchList l,uint32_t val)

{
  uint uVar1;
  
  if (l.p != 0) {
    do {
      uVar1 = l.p >> 1;
      if ((l.p & 1) == 0) {
        l.p = inst0[uVar1].out_opcode_ >> 4;
        inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | val << 4;
      }
      else {
        l.p = inst0[uVar1].field_1.out1_;
        inst0[uVar1].field_1.out1_ = val;
      }
    } while (l.p != 0);
  }
  return;
}

Assistant:

void PatchList::Patch(Prog::Inst *inst0, PatchList l, uint32_t val) {
  while (l.p != 0) {
    Prog::Inst* ip = &inst0[l.p>>1];
    if (l.p&1) {
      l.p = ip->out1();
      ip->out1_ = val;
    } else {
      l.p = ip->out();
      ip->set_out(val);
    }
  }
}